

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<long,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::ToMonthsOperator>
               (long *ldata,interval_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar2;
  duckdb *pdVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  ulong uVar6;
  bool bVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  idx_t iVar9;
  ulong uVar10;
  int64_t *piVar11;
  long *plVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  idx_t local_90;
  long *local_88;
  interval_t *local_80;
  idx_t local_78;
  ValidityMask *local_70;
  ulong local_68;
  ulong local_60;
  string local_58;
  long *local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_88 = ldata;
  local_70 = mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_80 = (interval_t *)&result_data->micros;
      iVar9 = 0;
      do {
        pdVar3 = (duckdb *)local_88[iVar9];
        bVar7 = TryCast::Operation<long,int>((int64_t)pdVar3,(int32_t *)&local_90,false);
        if (!bVar7) {
          auVar15 = __cxa_allocate_exception(0x10);
          CastExceptionText<long,int>(&local_58,pdVar3,auVar15._8_8_);
          InvalidInputException::InvalidInputException(auVar15._0_8_,(string *)&local_58);
          __cxa_throw(auVar15._0_8_,&InvalidInputException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        *(int32_t *)&local_80[-1].micros = (int)(local_90 & 0xffffffff);
        *(int *)((long)&local_80[-1].micros + 4) = (int)((local_90 & 0xffffffff) >> 0x20);
        local_80->months = 0;
        local_80->days = 0;
        iVar9 = iVar9 + 1;
        local_80 = (interval_t *)((long)local_80 + 0x10);
      } while (count != iVar9);
    }
  }
  else {
    local_80 = result_data;
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_90 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_58,(unsigned_long **)mask,&local_90);
      sVar5 = local_58._M_string_length;
      _Var4._M_p = local_58._M_dataplus._M_p;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)_Var4._M_p;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar5;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      }
      pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar8->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_60 = count + 0x3f >> 6;
      local_80 = (interval_t *)&local_80->micros;
      uVar10 = 0;
      local_68 = 0;
      plVar12 = local_88;
      local_78 = count;
      do {
        puVar1 = (local_70->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar14 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar14 = count;
          }
LAB_01b3c021:
          uVar6 = uVar10;
          if (uVar10 < uVar14) {
            piVar11 = (int64_t *)((long)local_80 + uVar10 * 2 * 8);
            do {
              pdVar3 = (duckdb *)plVar12[uVar10];
              bVar7 = TryCast::Operation<long,int>((int64_t)pdVar3,(int32_t *)&local_90,false);
              if (!bVar7) {
                auVar15 = __cxa_allocate_exception(0x10);
                CastExceptionText<long,int>(&local_58,pdVar3,auVar15._8_8_);
                InvalidInputException::InvalidInputException(auVar15._0_8_,(string *)&local_58);
                __cxa_throw(auVar15._0_8_,&InvalidInputException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              ((interval_t *)(piVar11 + -1))->months = (int)(local_90 & 0xffffffff);
              ((interval_t *)(piVar11 + -1))->days = (int)((local_90 & 0xffffffff) >> 0x20);
              *piVar11 = 0;
              uVar10 = uVar10 + 1;
              piVar11 = piVar11 + 2;
              uVar6 = uVar14;
              count = local_78;
            } while (uVar14 != uVar10);
          }
        }
        else {
          uVar2 = puVar1[local_68];
          uVar14 = uVar10 + 0x40;
          if (count <= uVar10 + 0x40) {
            uVar14 = count;
          }
          plVar12 = local_88;
          uVar6 = uVar14;
          if (uVar2 != 0) {
            if (uVar2 == 0xffffffffffffffff) goto LAB_01b3c021;
            uVar6 = uVar10;
            count = local_78;
            if (uVar10 < uVar14) {
              local_38 = local_88 + uVar10;
              piVar11 = (int64_t *)((long)local_80 + uVar10 * 2 * 8);
              uVar13 = 0;
              do {
                if ((uVar2 >> (uVar13 & 0x3f) & 1) != 0) {
                  pdVar3 = (duckdb *)local_38[uVar13];
                  bVar7 = TryCast::Operation<long,int>((int64_t)pdVar3,(int32_t *)&local_90,false);
                  if (!bVar7) {
                    auVar15 = __cxa_allocate_exception(0x10);
                    CastExceptionText<long,int>(&local_58,pdVar3,auVar15._8_8_);
                    InvalidInputException::InvalidInputException(auVar15._0_8_,(string *)&local_58);
                    __cxa_throw(auVar15._0_8_,&InvalidInputException::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  ((interval_t *)(piVar11 + -1))->months = (int)(local_90 & 0xffffffff);
                  ((interval_t *)(piVar11 + -1))->days = (int)((local_90 & 0xffffffff) >> 0x20);
                  *piVar11 = 0;
                }
                uVar13 = uVar13 + 1;
                piVar11 = piVar11 + 2;
                plVar12 = local_88;
                uVar6 = uVar14;
                count = local_78;
              } while (uVar14 - uVar10 != uVar13);
            }
          }
        }
        uVar10 = uVar6;
        local_68 = local_68 + 1;
      } while (local_68 != local_60);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}